

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_seq.c
# Opt level: O1

void jas_matrix_clip(jas_matrix_t *matrix,jas_seqent_t minval,jas_seqent_t maxval)

{
  jas_seqent_t **ppjVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  long *plVar5;
  long lVar6;
  long *plVar7;
  jas_seqent_t jVar8;
  
  lVar3 = matrix->numrows_;
  if ((0 < lVar3) && (0 < matrix->numcols_)) {
    ppjVar1 = matrix->rows_;
    if (ppjVar1 == (jas_seqent_t **)0x0) {
      __assert_fail("matrix->rows_",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/base/jas_seq.c"
                    ,0x133,"void jas_matrix_clip(jas_matrix_t *, jas_seqent_t, jas_seqent_t)");
    }
    if (lVar3 == 1) {
      lVar4 = 0;
    }
    else {
      lVar4 = (long)ppjVar1[1] - (long)*ppjVar1 >> 3;
    }
    plVar5 = *ppjVar1;
    do {
      if (0 < matrix->numcols_) {
        lVar6 = matrix->numcols_ + 1;
        plVar7 = plVar5;
        do {
          jVar8 = minval;
          if ((*plVar7 < minval) || (jVar8 = maxval, maxval < *plVar7)) {
            *plVar7 = jVar8;
          }
          plVar7 = plVar7 + 1;
          lVar6 = lVar6 + -1;
        } while (1 < lVar6);
      }
      plVar5 = plVar5 + lVar4;
      bVar2 = 1 < lVar3;
      lVar3 = lVar3 + -1;
    } while (bVar2);
  }
  return;
}

Assistant:

void jas_matrix_clip(jas_matrix_t *matrix, jas_seqent_t minval,
  jas_seqent_t maxval)
{
	jas_matind_t i;
	jas_matind_t j;
	jas_seqent_t v;
	jas_seqent_t *rowstart;
	jas_seqent_t *data;
	jas_matind_t rowstep;

	if (jas_matrix_numrows(matrix) > 0 && jas_matrix_numcols(matrix) > 0) {
		assert(matrix->rows_);
		rowstep = jas_matrix_rowstep(matrix);
		for (i = matrix->numrows_, rowstart = matrix->rows_[0]; i > 0; --i,
		  rowstart += rowstep) {
			data = rowstart;
			for (j = matrix->numcols_, data = rowstart; j > 0; --j,
			  ++data) {
				v = *data;
				if (v < minval) {
					*data = minval;
				} else if (v > maxval) {
					*data = maxval;
				}
			}
		}
	}
}